

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAQuadSensRhs1InternalDQ
              (IDAMem IDA_mem,int is,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector yyS,N_Vector ypS
              ,N_Vector resvalQ,N_Vector resvalQS,N_Vector yytmp,N_Vector yptmp,N_Vector tmpQS)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar4;
  undefined8 in_XMM0_Qa;
  double dVar5;
  double dVar6;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  sunrealtype norms;
  sunrealtype r2Del;
  sunrealtype Del;
  sunrealtype rDely;
  sunrealtype Dely;
  sunrealtype Delp;
  sunrealtype rdel;
  sunrealtype del;
  sunrealtype pbari;
  sunrealtype psave;
  int which;
  int nfel;
  int method;
  int retval;
  double local_d8;
  double local_d0;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  int local_4c;
  
  local_4c = 0;
  if (*(double *)(in_RDI + 0x28) < *(double *)(in_RDI + 8) ||
      *(double *)(in_RDI + 0x28) == *(double *)(in_RDI + 8)) {
    local_a8 = *(double *)(in_RDI + 8);
  }
  else {
    local_a8 = *(double *)(in_RDI + 0x28);
  }
  if (0.0 < local_a8) {
    if (*(double *)(in_RDI + 0x28) < *(double *)(in_RDI + 8) ||
        *(double *)(in_RDI + 0x28) == *(double *)(in_RDI + 8)) {
      local_b8 = *(double *)(in_RDI + 8);
    }
    else {
      local_b8 = *(double *)(in_RDI + 0x28);
    }
    local_b0 = sqrt(local_b8);
  }
  else {
    local_b0 = 0.0;
  }
  local_c0 = 1.0 / local_b0;
  dVar6 = *(double *)(*(long *)(in_RDI + 200) + (long)in_ESI * 8);
  iVar2 = *(int *)(*(long *)(in_RDI + 0xd0) + (long)in_ESI * 4);
  dVar1 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)iVar2 * 8);
  local_d8 = dVar6 * local_b0;
  dVar5 = (double)N_VWrmsNorm(in_R8,*(undefined8 *)(in_RDI + 0x278));
  if (local_c0 < dVar5 * dVar6) {
    local_c0 = dVar5 * dVar6;
  }
  dVar6 = 1.0 / (local_c0 / dVar6);
  bVar4 = *(int *)(in_RDI + 0xd8) != 1;
  if (bVar4) {
    if (bVar4) {
      if (dVar6 < local_d8) {
        local_d8 = dVar6;
      }
      N_VLinearSum(0x3ff0000000000000,local_d8,in_RDX,in_R8,in_stack_00000018);
      N_VLinearSum(0x3ff0000000000000,local_d8,in_RCX,in_R9,in_stack_00000020);
      *(double *)(*(long *)(in_RDI + 0xc0) + (long)iVar2 * 8) = dVar1 + local_d8;
      iVar3 = (**(code **)(in_RDI + 0x68))
                        (in_XMM0_Qa,in_stack_00000018,in_stack_00000020,in_stack_00000010,
                         *(undefined8 *)(in_RDI + 0x18));
      local_4c = 1;
      if (iVar3 != 0) {
        return iVar3;
      }
      N_VLinearSum(1.0 / local_d8,-(1.0 / local_d8),in_stack_00000010,in_stack_00000008,
                   in_stack_00000010);
    }
  }
  else {
    local_d0 = local_d8;
    if (dVar6 < local_d8) {
      local_d0 = dVar6;
    }
    N_VLinearSum(0x3ff0000000000000,local_d0,in_RDX,in_R8,in_stack_00000018);
    N_VLinearSum(0x3ff0000000000000,local_d0,in_RCX,in_R9,in_stack_00000020);
    *(double *)(*(long *)(in_RDI + 0xc0) + (long)iVar2 * 8) = dVar1 + local_d0;
    iVar3 = (**(code **)(in_RDI + 0x68))
                      (in_XMM0_Qa,in_stack_00000018,in_stack_00000020,in_stack_00000010,
                       *(undefined8 *)(in_RDI + 0x18));
    if (iVar3 != 0) {
      return iVar3;
    }
    N_VLinearSum(-local_d0,0x3ff0000000000000,in_R8,in_RDX,in_stack_00000018);
    N_VLinearSum(-local_d0,0x3ff0000000000000,in_R9,in_RCX,in_stack_00000020);
    *(double *)(*(long *)(in_RDI + 0xc0) + (long)iVar2 * 8) = dVar1 - local_d0;
    iVar3 = (**(code **)(in_RDI + 0x68))
                      (in_XMM0_Qa,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                       *(undefined8 *)(in_RDI + 0x18));
    local_4c = 2;
    if (iVar3 != 0) {
      return iVar3;
    }
    N_VLinearSum(0.5 / local_d0,-(0.5 / local_d0),in_stack_00000010,in_stack_00000028,
                 in_stack_00000010);
  }
  *(double *)(*(long *)(in_RDI + 0xc0) + (long)iVar2 * 8) = dVar1;
  *(long *)(in_RDI + 0x5e8) = (long)local_4c + *(long *)(in_RDI + 0x5e8);
  return 0;
}

Assistant:

static int IDAQuadSensRhs1InternalDQ(IDAMem IDA_mem, int is, sunrealtype t,
                                     N_Vector yy, N_Vector yp, N_Vector yyS,
                                     N_Vector ypS, N_Vector resvalQ,
                                     N_Vector resvalQS, N_Vector yytmp,
                                     N_Vector yptmp, N_Vector tmpQS)
{
  int retval, method;
  int nfel = 0, which;
  sunrealtype psave, pbari;
  sunrealtype del, rdel;
  sunrealtype Delp;
  sunrealtype Dely, rDely;
  sunrealtype Del, r2Del;
  sunrealtype norms;

  del  = SUNRsqrt(SUNMAX(IDA_mem->ida_rtol, IDA_mem->ida_uround));
  rdel = ONE / del;

  pbari = IDA_mem->ida_pbar[is];

  which = IDA_mem->ida_plist[is];

  psave = IDA_mem->ida_p[which];

  Delp  = pbari * del;
  norms = N_VWrmsNorm(yyS, IDA_mem->ida_ewt) * pbari;
  rDely = SUNMAX(norms, rdel) / pbari;
  Dely  = ONE / rDely;

  method = (IDA_mem->ida_DQtype == IDA_CENTERED) ? CENTERED1 : FORWARD1;

  switch (method)
  {
  case CENTERED1:

    Del   = SUNMIN(Dely, Delp);
    r2Del = HALF / Del;

    N_VLinearSum(ONE, yy, Del, yyS, yytmp);
    N_VLinearSum(ONE, yp, Del, ypS, yptmp);
    IDA_mem->ida_p[which] = psave + Del;

    retval = IDA_mem->ida_rhsQ(t, yytmp, yptmp, resvalQS, IDA_mem->ida_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(-Del, yyS, ONE, yy, yytmp);
    N_VLinearSum(-Del, ypS, ONE, yp, yptmp);

    IDA_mem->ida_p[which] = psave - Del;

    retval = IDA_mem->ida_rhsQ(t, yytmp, yptmp, tmpQS, IDA_mem->ida_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(r2Del, resvalQS, -r2Del, tmpQS, resvalQS);

    break;

  case FORWARD1:

    Del  = SUNMIN(Dely, Delp);
    rdel = ONE / Del;

    N_VLinearSum(ONE, yy, Del, yyS, yytmp);
    N_VLinearSum(ONE, yp, Del, ypS, yptmp);
    IDA_mem->ida_p[which] = psave + Del;

    retval = IDA_mem->ida_rhsQ(t, yytmp, yptmp, resvalQS, IDA_mem->ida_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(rdel, resvalQS, -rdel, resvalQ, resvalQS);

    break;
  }

  IDA_mem->ida_p[which] = psave;
  /* Increment counter nrQeS */
  IDA_mem->ida_nrQeS += nfel;

  return (0);
}